

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error __thiscall
llvm::
handleErrorImpl<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__0,llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__1>
          (llvm *this,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload,
          anon_class_1_0_00000001 *Handler,anon_class_8_1_54a397f7 *Handlers)

{
  anon_class_8_1_54a397f7 *H;
  bool bVar1;
  type E;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_48 [3];
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_30;
  anon_class_8_1_54a397f7 *local_28;
  anon_class_8_1_54a397f7 *Handlers_local;
  anon_class_1_0_00000001 *Handler_local;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload_local;
  
  local_28 = Handlers;
  Handlers_local = (anon_class_8_1_54a397f7 *)Handler;
  Handler_local = (anon_class_1_0_00000001 *)Payload;
  Payload_local = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)this
  ;
  E = std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::operator*
                (Payload);
  bVar1 = ErrorHandlerTraits<void_(&)(llvm::DWARFDebugNames::SentinelError_&)>::appliesTo(E);
  H = Handlers_local;
  if (bVar1) {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (&local_30,Payload);
    ErrorHandlerTraits<void(&)(llvm::DWARFDebugNames::SentinelError&)>::
    apply<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__0>
              ((ErrorHandlerTraits<void(&)(llvm::DWARFDebugNames::SentinelError&)> *)this,
               (anon_class_1_0_00000001 *)H,&local_30);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (&local_30);
  }
  else {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (local_48,Payload);
    handleErrorImpl<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__1>
              (this,local_48,local_28);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (local_48);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}